

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::insert<kj::StringPtr,kj::StringPtr>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,size_t pos,StringPtr *params)

{
  ArrayPtr<kj::StringPtr> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ArrayPtr<const_char> *pAVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_00;
  ArrayPtr<const_char> *in_R9;
  Maybe<unsigned_long> MVar7;
  ulong local_c8;
  char *local_c0;
  size_t local_b8;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *local_b0;
  StringPtr *local_a8;
  char *local_a0;
  size_t local_98;
  HashBucket local_88;
  HashBucket local_80;
  HashBucket *local_78;
  HashBucket *s;
  HashBucket *_s944;
  HashBucket *bucket;
  uint i;
  Maybe<kj::_::HashBucket_&> erasedSlot;
  uint hashCode;
  StringPtr *params_local;
  size_t pos_local;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::StringPtr> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.ptr;
  table_local.ptr = (StringPtr *)pos;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  sVar4 = ArrayPtr<kj::StringPtr>::size((ArrayPtr<kj::StringPtr> *)&this_local);
  if (sVar3 << 1 < (sVar4 + 1 + this_00->erasedCount) * 3) {
    sVar3 = ArrayPtr<kj::StringPtr>::size((ArrayPtr<kj::StringPtr> *)&this_local);
    rehash(this_00,(sVar3 + 1) * 3);
  }
  erasedSlot.ptr = (HashBucket *)in_R9->ptr;
  uVar2 = kj::_::anon_unknown_0::StringHasher::hashCode((StringHasher *)this_00,(StringPtr)*in_R9);
  Maybe<kj::_::HashBucket_&>::Maybe((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
  do {
    _s944 = Array<kj::_::HashBucket>::operator[](&this_00->buckets,(ulong)bucket._4_4_);
    bVar1 = kj::_::HashBucket::isEmpty(_s944);
    if (bVar1) {
      s = kj::_::readMaybe<kj::_::HashBucket>
                    ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
      if (s == (HashBucket *)0x0) {
        kj::_::HashBucket::HashBucket(&local_88,uVar2,(uint)params);
        *_s944 = local_88;
      }
      else {
        this_00->erasedCount = this_00->erasedCount - 1;
        local_78 = s;
        kj::_::HashBucket::HashBucket(&local_80,uVar2,(uint)params);
        *local_78 = local_80;
      }
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
      aVar6 = extraout_RDX;
LAB_001eeafc:
      MVar7.ptr.field_1.value = aVar6.value;
      MVar7.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar7.ptr;
    }
    bVar1 = kj::_::HashBucket::isErased(_s944);
    if (bVar1) {
      bVar1 = Maybe<kj::_::HashBucket_&>::operator==
                        ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
      if (bVar1) {
        Maybe<kj::_::HashBucket_&>::operator=
                  ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8,_s944);
      }
    }
    else if (_s944->hash == uVar2) {
      local_b0 = this_local;
      local_a8 = table_local.ptr;
      table_00.size_ = (size_t)table_local.ptr;
      table_00.ptr = (StringPtr *)this_local;
      pAVar5 = &kj::_::HashBucket::getRow<kj::StringPtr>(_s944,table_00)->content;
      local_a0 = pAVar5->ptr;
      local_98 = pAVar5->size_;
      local_c0 = in_R9->ptr;
      local_b8 = in_R9->size_;
      bVar1 = kj::_::anon_unknown_0::StringHasher::matches
                        ((StringHasher *)this_00,(StringPtr)*pAVar5,(StringPtr)*in_R9);
      if (bVar1) {
        uVar2 = kj::_::HashBucket::getPos(_s944);
        local_c8 = (ulong)uVar2;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_c8);
        aVar6 = extraout_RDX_00;
        goto LAB_001eeafc;
      }
    }
    sVar3 = kj::_::probeHash(&this_00->buckets,(ulong)bucket._4_4_);
    bucket._4_4_ = (uint)sVar3;
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }